

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O1

void __thiscall
jbcoin::STValidation::STValidation(STValidation *this,SerialIter *sit,bool checkSignature)

{
  atomic<int> *paVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  Counter *pCVar5;
  ulong uVar6;
  Sink *pSVar7;
  ValueHolder local_1e0;
  undefined8 uStack_1d8;
  uint32_t local_1d0;
  Blob local_1c8;
  Slice local_1b0;
  undefined1 local_1a0 [392];
  
  getFormat();
  STObject::STObject(&this->super_STObject,&getFormat::holder.format,sit,(SField *)sfValidation);
  pCVar5 = CountedObject<jbcoin::STValidation>::getCounter();
  LOCK();
  paVar1 = &(pCVar5->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STValidation_002d8110;
  (this->mSeen).__d.__r = 0;
  (this->mNodeID).pn[0] = 0;
  (this->mNodeID).pn[1] = 0;
  (this->mNodeID).pn[2] = 0;
  (this->mNodeID).pn[3] = 0;
  *(undefined8 *)((long)(this->mNodeID).pn + 0xd) = 0;
  STObject::getFieldVL(&local_1c8,&this->super_STObject,(SField *)sfSigningPubKey);
  local_1b0.size_ =
       CONCAT44(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_,
                (Severity)
                local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) -
       (long)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1b0.data_ =
       local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  PublicKey::PublicKey((PublicKey *)local_1a0,&local_1b0);
  calcNodeID((NodeID *)&local_1e0,(PublicKey *)local_1a0);
  (this->mNodeID).pn[4] = local_1d0;
  *(ValueHolder *)(this->mNodeID).pn = local_1e0;
  *(undefined8 *)((this->mNodeID).pn + 2) = uStack_1d8;
  if ((Sink *)local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (Sink *)0x0) {
    operator_delete(local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((this->mNodeID).pn[0] == 0) {
    uVar2 = 0;
    do {
      uVar6 = uVar2;
      if (uVar6 == 4) {
        uVar6 = 4;
        break;
      }
      uVar2 = uVar6 + 1;
    } while ((this->mNodeID).pn[uVar6 + 1] == 0);
    if (3 < uVar6) {
      __assert_fail("mNodeID.isNonZero ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STValidation.cpp"
                    ,0x22,"jbcoin::STValidation::STValidation(SerialIter &, bool)");
    }
  }
  if (checkSignature) {
    STObject::getSigningHash((uint256 *)local_1a0,&this->super_STObject,HashPrefix::validation);
    bVar3 = isValid(this,(uint256 *)local_1a0);
    if (!bVar3) {
      debugSink();
      pSVar7 = DebugSink::get(&debugSink::_);
      iVar4 = (*pSVar7->_vptr_Sink[2])(pSVar7,4);
      if ((char)iVar4 != '\0') {
        debugSink();
        local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)DebugSink::get(&debugSink::_);
        local_1c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = kError;
        beast::Journal::ScopedStream::ScopedStream<char[19]>
                  ((ScopedStream *)local_1a0,(Stream *)&local_1c8,
                   (char (*) [19])"Invalid validation");
        STObject::getJson((STObject *)&local_1e0,(int)this);
        Json::operator<<((ostream *)(local_1a0 + 0x10),(Value *)&local_1e0);
        Json::Value::~Value((Value *)&local_1e0);
        beast::Journal::ScopedStream::~ScopedStream((ScopedStream *)local_1a0);
      }
      Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Invalid validation");
    }
  }
  return;
}

Assistant:

STValidation::STValidation (SerialIter& sit, bool checkSignature)
    : STObject (getFormat (), sit, sfValidation)
{
    mNodeID = calcNodeID(
        PublicKey(makeSlice (getFieldVL (sfSigningPubKey))));
    assert (mNodeID.isNonZero ());

    if  (checkSignature && !isValid ())
    {
        JLOG (debugLog().error())
            << "Invalid validation" << getJson (0);
        Throw<std::runtime_error> ("Invalid validation");
    }
}